

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

Status __thiscall
soplex::SPxSolverBase<double>::getRedCostSol
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  ClassSet<soplex::SVSetBase<double>::DLPSV> *this_00;
  Status *pSVar1;
  pointer pdVar2;
  pointer pdVar3;
  UpdateVector<double> *pUVar4;
  DataKey DVar5;
  double dVar6;
  int iVar7;
  Status SVar8;
  SPxStatusException *this_01;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  DataKey local_70;
  double local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  string local_50;
  
  if (this->initialized == false) {
    this_01 = (SPxStatusException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&local_50,"XSOLVE09 No Problem loaded",(allocator *)&local_70);
    SPxStatusException::SPxStatusException(this_01,&local_50);
    __cxa_throw(this_01,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  if (this->theRep == ROW) {
    VectorBase<double>::clear(p_vector);
    this_00 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set;
    uVar9 = (ulong)(uint)(this->thecovectors->set).thenum;
    if ((this->super_SPxLPBase<double>).thesense == MINIMIZE) {
      for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
        DVar5 = (this->super_SPxBasisBase<double>).theBaseId.data[uVar9 - 1].super_DataKey;
        if (0 < DVar5.info) {
          local_68 = -(this->theFvec->super_VectorBase<double>).val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9 + 0xffffffffffffffff];
          uStack_60 = 0;
          uStack_5c = 0x80000000;
          local_70 = DVar5;
          SPxColId::SPxColId((SPxColId *)&local_50,(SPxId *)&local_70);
          iVar7 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number(this_00,(DataKey *)&local_50);
          (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar7] = local_68;
        }
      }
    }
    else {
      for (; 0 < (int)uVar9; uVar9 = uVar9 - 1) {
        DVar5 = (this->super_SPxBasisBase<double>).theBaseId.data[uVar9 - 1].super_DataKey;
        if (0 < DVar5.info) {
          local_68 = (this->theFvec->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9 + 0xffffffffffffffff];
          local_70 = DVar5;
          SPxColId::SPxColId((SPxColId *)&local_50,(SPxId *)&local_70);
          iVar7 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number(this_00,(DataKey *)&local_50);
          (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iVar7] = local_68;
        }
      }
    }
  }
  else {
    uVar11 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum;
    pSVar1 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    pdVar2 = (p_vector->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pUVar4 = this->thePvec;
    uVar10 = 0;
    uVar9 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar9 = uVar10;
    }
    for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      uVar11 = pSVar1[uVar10] + P_FREE;
      if ((7 < uVar11) || (dVar6 = 0.0, (0xabU >> (uVar11 & 0x1f) & 1) == 0)) {
        dVar6 = pdVar3[uVar10] -
                (pUVar4->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar10];
      }
      pdVar2[uVar10] = dVar6;
    }
    if ((this->super_SPxLPBase<double>).thesense == MINIMIZE) {
      local_50._M_dataplus._M_p = (pointer)0xbff0000000000000;
      VectorBase<double>::operator*=(p_vector,(double *)&local_50);
    }
  }
  SVar8 = status(this);
  return SVar8;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getRedCostSol(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE09 No Problem loaded");
      // return NOT_INIT;
   }

   if(rep() == ROW)
   {
      int i;
      p_vector.clear();

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = -fVec()[i];
         }
      }
      else
      {
         for(i = dim() - 1; i >= 0; --i)
         {
            if(this->baseId(i).isSPxColId())
               p_vector[ this->number(SPxColId(this->baseId(i))) ] = fVec()[i];
         }
      }
   }
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::D_FREE:
         case SPxBasisBase<R>::Desc::D_ON_UPPER:
         case SPxBasisBase<R>::Desc::D_ON_LOWER:
         case SPxBasisBase<R>::Desc::D_ON_BOTH:
         case SPxBasisBase<R>::Desc::D_UNDEFINED:
            p_vector[i] = 0;
            break;

         default:
            p_vector[i] = this->maxObj()[i] - (*thePvec)[i];
         }
      }

      if(this->spxSense() == SPxLPBase<R>::MINIMIZE)
         p_vector *= -1.0;
   }

   return status();
}